

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

channel_s * fio_filter_dup_lock_internal(channel_s *ch,uint64_t hashed,fio_collection_s *c)

{
  channel_s *ch_00;
  fio_collection_s *c_local;
  uint64_t hashed_local;
  channel_s *ch_local;
  
  fio_lock(&c->lock);
  ch_00 = fio_ch_set_insert(&c->channels,hashed,ch);
  fio_channel_dup(ch_00);
  fio_lock(&ch_00->lock);
  fio_unlock(&c->lock);
  return ch_00;
}

Assistant:

static inline channel_s *fio_filter_dup_lock_internal(channel_s *ch,
                                                      uint64_t hashed,
                                                      fio_collection_s *c) {
  fio_lock(&c->lock);
  ch = fio_ch_set_insert(&c->channels, hashed, ch);
  fio_channel_dup(ch);
  fio_lock(&ch->lock);
  fio_unlock(&c->lock);
  return ch;
}